

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void process_tpl_stats_frame(AV1_COMP *cpi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int mi_col;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  long *in_RDI;
  double dVar9;
  int gfu_boost_1;
  int gfu_boost;
  double min_boost_factor;
  double dist_scaled;
  int64_t mc_dep_delta;
  double cbcmp;
  TplDepStats *this_stats;
  int col;
  int row;
  int mi_cols_sr;
  int col_step_sr;
  int row_step;
  int step;
  double cbcmp_base;
  double mc_dep_cost_base;
  double intra_cost_base;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int tpl_idx;
  AV1_COMMON *cm;
  GF_GROUP *gf_group;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int mi_row;
  double local_58;
  double local_50;
  double local_48;
  
  lVar1 = *in_RDI;
  lVar2 = *in_RDI;
  pcVar8 = (char *)(*(long *)(lVar2 + 0x12298) + (long)(int)(uint)*(byte *)(in_RDI + 0xe258) * 0x60)
  ;
  lVar3 = *(long *)(pcVar8 + 8);
  if (*pcVar8 != '\0') {
    iVar7 = *(int *)(pcVar8 + 0x40);
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 1.0;
    mi_col = 1 << (*(byte *)(lVar2 + 0xd2ac) & 0x1f);
    iVar4 = coded_to_superres_mi(mi_col,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar5 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
    for (mi_row = 0; mi_row < *(int *)((long)in_RDI + 0x3c194); mi_row = mi_col + mi_row) {
      for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < iVar5;
          in_stack_ffffffffffffff90 = iVar4 + in_stack_ffffffffffffff90) {
        iVar6 = av1_tpl_ptr_pos(mi_row,in_stack_ffffffffffffff90,iVar7,*(uint8_t *)(lVar2 + 0xd2ac))
        ;
        in_stack_ffffffffffffff88 = (double)(lVar3 + (long)iVar6 * 200);
        in_stack_ffffffffffffff80 = (double)*(long *)((long)in_stack_ffffffffffffff88 + 8);
        in_stack_ffffffffffffff78 =
             (double)((*(long *)((long)in_stack_ffffffffffffff88 + 0x40) *
                       (long)*(int *)(pcVar8 + 0x54) + 0x100 >> 9) +
                     *(long *)((long)in_stack_ffffffffffffff88 + 0x48) * 0x80);
        in_stack_ffffffffffffff70 = (double)(*(long *)((long)in_stack_ffffffffffffff88 + 0x18) << 7)
        ;
        dVar9 = log(in_stack_ffffffffffffff70);
        local_48 = dVar9 * in_stack_ffffffffffffff80 + local_48;
        dVar9 = log(in_stack_ffffffffffffff70 + (double)(long)in_stack_ffffffffffffff78);
        local_50 = dVar9 * in_stack_ffffffffffffff80 + local_50;
        local_58 = in_stack_ffffffffffffff80 + local_58;
      }
    }
    if ((local_50 != 0.0) || (NAN(local_50))) {
      dVar9 = exp((local_48 - local_50) / local_58);
      in_RDI[0xc054] = (long)dVar9;
      iVar7 = is_frame_tpl_eligible((GF_GROUP *)(lVar1 + 400),(uint8_t)in_RDI[0xe258]);
      if (iVar7 != 0) {
        if (*(int *)(*in_RDI + 0x5a88) == 0) {
          iVar7 = combine_prior_with_tpl_boost
                            ((double)CONCAT44(mi_row,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,
                             (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             SUB84(in_stack_ffffffffffffff80,0),
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
          *(int *)(*in_RDI + 0x8b3c) = iVar7;
        }
        else {
          dVar9 = sqrt((double)*(int *)(*in_RDI + 0xac60));
          get_gfu_boost_from_r0_lap
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (int)((ulong)dVar9 >> 0x20));
          iVar7 = combine_prior_with_tpl_boost
                            ((double)CONCAT44(mi_row,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,
                             (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             SUB84(in_stack_ffffffffffffff80,0),
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
          *(int *)(*in_RDI + 0x8b3c) = iVar7;
        }
      }
    }
    else {
      *pcVar8 = '\0';
    }
  }
  return;
}

Assistant:

static void process_tpl_stats_frame(AV1_COMP *cpi) {
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  AV1_COMMON *const cm = &cpi->common;

  assert(IMPLIES(gf_group->size > 0, cpi->gf_frame_index < gf_group->size));

  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  if (tpl_frame->is_valid) {
    int tpl_stride = tpl_frame->stride;
    double intra_cost_base = 0;
    double mc_dep_cost_base = 0;
    double cbcmp_base = 1;
    const int step = 1 << tpl_data->tpl_stats_block_mis_log2;
    const int row_step = step;
    const int col_step_sr =
        coded_to_superres_mi(step, cm->superres_scale_denominator);
    const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

    for (int row = 0; row < cm->mi_params.mi_rows; row += row_step) {
      for (int col = 0; col < mi_cols_sr; col += col_step_sr) {
        TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
            row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
        double cbcmp = (double)(this_stats->srcrf_dist);
        int64_t mc_dep_delta =
            RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                   this_stats->mc_dep_dist);
        double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
        intra_cost_base += log(dist_scaled) * cbcmp;
        mc_dep_cost_base += log(dist_scaled + mc_dep_delta) * cbcmp;
        cbcmp_base += cbcmp;
      }
    }

    if (mc_dep_cost_base == 0) {
      tpl_frame->is_valid = 0;
    } else {
      cpi->rd.r0 = exp((intra_cost_base - mc_dep_cost_base) / cbcmp_base);
      if (is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
        if (cpi->ppi->lap_enabled) {
          double min_boost_factor = sqrt(cpi->ppi->p_rc.baseline_gf_interval);
          const int gfu_boost = get_gfu_boost_from_r0_lap(
              min_boost_factor, MAX_GFUBOOST_FACTOR, cpi->rd.r0,
              cpi->ppi->p_rc.num_stats_required_for_gfu_boost);
          cpi->ppi->p_rc.gfu_boost = combine_prior_with_tpl_boost(
              min_boost_factor, MAX_BOOST_COMBINE_FACTOR,
              cpi->ppi->p_rc.gfu_boost, gfu_boost,
              cpi->ppi->p_rc.num_stats_used_for_gfu_boost);
        } else {
          // TPL may only look at a subset of frame in the gf group when the
          // speed feature 'reduce_num_frames' is on, which affects the r0
          // calcuation. Thus, to compensate for TPL not using all frames a
          // factor to adjust r0 is used.
          const int gfu_boost =
              (int)(200.0 * cpi->ppi->tpl_data.r0_adjust_factor / cpi->rd.r0);
          cpi->ppi->p_rc.gfu_boost = combine_prior_with_tpl_boost(
              MIN_BOOST_COMBINE_FACTOR, MAX_BOOST_COMBINE_FACTOR,
              cpi->ppi->p_rc.gfu_boost, gfu_boost, cpi->rc.frames_to_key);
        }
      }
    }
  }
}